

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::Vertex2DTextureCase::init(Vertex2DTextureCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  pointer pPVar1;
  RenderTarget *pRVar2;
  ShaderProgram *this_00;
  Texture2D *this_01;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar3;
  NotSupportedError *pNVar4;
  uint uVar5;
  pointer_____offset_0x10___ *ppuVar6;
  int levelNdx;
  deUint32 dVar7;
  long lVar8;
  int i;
  int levelNdx_00;
  long lVar9;
  RGBA local_1b0;
  RGBA local_1ac;
  Vec4 gMin;
  Vec4 cScale;
  Vec4 cBias;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vec4 gMax;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  GLint maxVertexTextures;
  Vector<float,_4> local_f0 [12];
  
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar2->m_numSamples != 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxVertexTextures,"MSAA config not supported by this test",
               (allocator<char> *)&cBias);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)&maxVertexTextures);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cBias,
             "#version 300 es\nin highp vec2 a_position;\nin highp vec2 a_texCoord;\nuniform highp sampler2D u_texture;\nuniform highp float u_lod;\nout mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,(allocator<char> *)&gMin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cScale,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,(allocator<char> *)&gMax);
  glu::makeVtxFragSources((ProgramSources *)&maxVertexTextures,(string *)&cBias,(string *)&cScale);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)&maxVertexTextures);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources((ProgramSources *)&maxVertexTextures);
  std::__cxx11::string::~string((string *)&cScale);
  std::__cxx11::string::~string((string *)&cBias);
  if ((this->m_program->m_program).m_info.linkOk == true) {
    for (lVar9 = 0x12; lVar9 != 0x14; lVar9 = lVar9 + 1) {
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x80,0x80);
      (&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode)[lVar9] =
           (_func_int **)this_01;
    }
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)&maxVertexTextures,
               (TextureFormat *)&this->m_textures[0]->m_refTexture);
    tcu::Vector<float,_4>::Vector(&cBias,(Vector<float,_4> *)&maxVertexTextures);
    tcu::operator-((tcu *)&cScale,local_f0,(Vector<float,_4> *)&maxVertexTextures);
    lVar8 = 0;
    uVar3 = extraout_RAX;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      local_148.m_data[0] = -0.5;
      local_148.m_data[1] = -0.5;
      local_148.m_data[2] = -0.5;
      local_148.m_data[3] = 2.0;
      tcu::operator*((tcu *)&gMax,&local_148,&cScale);
      tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
      local_158.m_data[0] = 1.0;
      local_158.m_data[1] = 1.0;
      local_158.m_data[2] = 1.0;
      local_158.m_data[3] = 0.0;
      tcu::operator*((tcu *)&local_148,&local_158,&cScale);
      tcu::operator+((tcu *)&gMax,&local_148,&cBias);
      tcu::Texture2D::allocLevel(&this->m_textures[0]->m_refTexture,(int)lVar9);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((this->m_textures[0]->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar8 + -8),&gMin,&gMax);
      lVar8 = lVar8 + 0x28;
      uVar3 = extraout_RAX_00;
    }
    dVar7 = 0xffffffff;
    levelNdx_00 = 0;
    uVar5 = 0;
    for (lVar9 = 0; lVar9 != 0x140; lVar9 = lVar9 + 0x28) {
      tcu::Texture2D::allocLevel(&this->m_textures[1]->m_refTexture,levelNdx_00);
      pPVar1 = (this->m_textures[1]->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1ac.m_value = uVar5 | 0xff000000;
      tcu::RGBA::toVec(&local_1ac);
      tcu::operator*((tcu *)&gMax,&local_148,&cScale);
      tcu::operator+((tcu *)&gMin,&gMax,&cBias);
      local_1b0.m_value = dVar7;
      tcu::RGBA::toVec(&local_1b0);
      tcu::operator*((tcu *)&local_110,&local_120,&cScale);
      tcu::operator+((tcu *)&local_158,&local_110,&cBias);
      tcu::fillWithGrid((PixelBufferAccess *)
                        ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),4,
                        &gMin,&local_158);
      uVar5 = uVar5 + 0x1fffff;
      dVar7 = dVar7 - 0x1fffff;
      levelNdx_00 = levelNdx_00 + 1;
      uVar3 = extraout_RAX_01;
    }
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      uVar5 = (*this->m_textures[lVar9]->_vptr_Texture2D[2])();
      uVar3 = (ulong)uVar5;
    }
    return (int)uVar3;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,&maxVertexTextures);
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if (maxVertexTextures < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Vertex texture image units not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x23c);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar4,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x23e);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar4,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void Vertex2DTextureCase::init (void)
{
	const char* const vertexShader =
		"#version 300 es\n"
		"in highp vec2 a_position;\n"
		"in highp vec2 a_texCoord;\n"
		"uniform highp sampler2D u_texture;\n"
		"uniform highp float u_lod;\n"
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShader =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	dEQP_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShader, fragmentShader));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.
	try
	{
		// Compute suitable power-of-two sizes (for mipmaps).
		const int texWidth		= 1 << deLog2Ceil32(MAX_2D_RENDER_WIDTH / 2);
		const int texHeight		= 1 << deLog2Ceil32(MAX_2D_RENDER_HEIGHT / 2);

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);
		}

		const bool						mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
		const int						numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const Vec4 gMin = Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
			const Vec4 gMax = Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const deUint32 step		= 0x00ffffff / numLevels;
			const deUint32 rgb		= step*levelNdx;
			const deUint32 colorA	= 0xff000000 | rgb;
			const deUint32 colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Vertex2DTextureCase::deinit();
		throw;
	}
}